

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O3

void ImGui_ImplGlfw_Shutdown(void)

{
  long lVar1;
  
  if (g_InstalledCallbacks != '\0') {
    glfwSetMouseButtonCallback(g_Window,g_PrevUserCallbackMousebutton);
    glfwSetScrollCallback(g_Window,g_PrevUserCallbackScroll);
    glfwSetKeyCallback(g_Window,g_PrevUserCallbackKey);
    glfwSetCharCallback(g_Window,g_PrevUserCallbackChar);
    g_InstalledCallbacks = '\0';
  }
  lVar1 = 0;
  do {
    glfwDestroyCursor(*(GLFWcursor **)((long)g_MouseCursors + lVar1));
    *(undefined8 *)((long)g_MouseCursors + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x48);
  return;
}

Assistant:

void ImGui_ImplGlfw_Shutdown()
{
    if (g_InstalledCallbacks)
    {
        glfwSetMouseButtonCallback(g_Window, g_PrevUserCallbackMousebutton);
        glfwSetScrollCallback(g_Window, g_PrevUserCallbackScroll);
        glfwSetKeyCallback(g_Window, g_PrevUserCallbackKey);
        glfwSetCharCallback(g_Window, g_PrevUserCallbackChar);
        g_InstalledCallbacks = false;
    }

    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
    {
        glfwDestroyCursor(g_MouseCursors[cursor_n]);
        g_MouseCursors[cursor_n] = NULL;
    }
    g_ClientApi = GlfwClientApi_Unknown;
}